

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

bool cfd::core::ComparePsbtData
               (uint8_t *src,size_t src_len,uint8_t *dest,size_t dest_len,string *item_name,
               string *key,bool ignore_duplicate_error)

{
  int iVar1;
  CfdException *this;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (src_len == dest_len) {
    iVar1 = bcmp(src,dest,src_len);
    if (ignore_duplicate_error || iVar1 == 0) {
      return iVar1 == 0;
    }
  }
  else if (ignore_duplicate_error) {
    return false;
  }
  if (key->_M_string_length == 0) {
    local_60._0_8_ = "cfdcore_psbt.cpp";
    local_60._8_4_ = 0x132;
    local_50._M_allocated_capacity = 0x586674;
    logger::log<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_60,kCfdLogLevelWarning,"psbt {} already exist.",item_name)
    ;
  }
  else {
    local_60._0_8_ = "cfdcore_psbt.cpp";
    local_60._8_4_ = 0x134;
    local_50._M_allocated_capacity = 0x586674;
    logger::log<std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_60,kCfdLogLevelWarning,"psbt {} already exist. key[{}]",
               item_name,key);
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::operator+(&local_40,"psbt ",item_name);
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_40);
  local_60._0_8_ = *plVar2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._0_8_ == paVar3) {
    local_50._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_50._8_8_ = plVar2[3];
    local_60._0_8_ = &local_50;
  }
  else {
    local_50._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_60._8_8_ = plVar2[1];
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_60);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool ComparePsbtData(
    uint8_t *src, size_t src_len, const uint8_t *dest, size_t dest_len,
    const std::string &item_name, const std::string &key,
    bool ignore_duplicate_error) {
  bool is_compare = false;
  if ((src_len == dest_len) && (memcmp(src, dest, src_len) == 0)) {
    is_compare = true;
  } else if (ignore_duplicate_error) {
    // do nothing
  } else {
    if (key.empty()) {
      warn(CFD_LOG_SOURCE, "psbt {} already exist.", item_name);
    } else {
      warn(CFD_LOG_SOURCE, "psbt {} already exist. key[{}]", item_name, key);
    }
    throw CfdException(
        kCfdIllegalArgumentError, "psbt " + item_name + " duplicated error.");
  }
  return is_compare;
}